

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vInputs)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar7;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  uint uVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  word *__ptr_00;
  int *piVar12;
  int fCompl;
  uint local_3c;
  word *local_38;
  
  pAVar10 = pObj->pNtk;
  uVar4 = pObj->Id;
  Vec_IntFillExtra(&pAVar10->vTravIds,uVar4 + 1,(int)vInputs);
  if (-1 < (int)uVar4) {
    piVar12 = &pObj->Id;
    uVar8 = extraout_RDX;
    do {
      if ((pAVar10->vTravIds).nSize <= (int)uVar4) break;
      pAVar2 = pObj->pNtk;
      iVar5 = pAVar2->nTravIds;
      if ((pAVar10->vTravIds).pArray[uVar4] == iVar5) {
        return;
      }
      iVar1 = *piVar12;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,(int)uVar8);
      if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar1] = iVar5;
      uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
      if (uVar4 != 7) {
        if (uVar4 == 2) {
          return;
        }
        if (uVar4 == 5) {
          return;
        }
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                      ,0xf4,
                      "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      iVar5 = Abc_NodeIsExorType(pObj);
      if (iVar5 != 0) {
        __ptr = Abc_NtkShareSuperXor(pObj,(int *)&local_3c,&p->nFoundGates);
        uVar4 = __ptr->nSize;
        if ((int)uVar4 < 2) {
          if (uVar4 != 1) goto LAB_002616cd;
        }
        else if ((int)uVar4 < p->nMultiSize) goto LAB_002616fa;
        local_38 = __ptr->pArray;
        uVar11 = 0;
        goto LAB_002615f5;
      }
      Abc_NtkTraverseSupersXor_rec
                (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vInputs);
      pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
      pAVar10 = pObj->pNtk;
      piVar12 = &pObj->Id;
      uVar4 = pObj->Id;
      Vec_IntFillExtra(&pAVar10->vTravIds,uVar4 + 1,Fill);
      uVar8 = extraout_RDX_00;
    } while (-1 < (int)uVar4);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  while( true ) {
    Vec_IntPush(p_00,p->vObj2Lit->nSize);
    uVar11 = uVar11 + 1;
    if (uVar4 == uVar11) break;
LAB_002615f5:
    uVar6 = (uint)local_38[uVar11];
    if (((int)uVar6 < 0) || (vInputs->nSize <= (int)uVar6)) goto LAB_00261772;
    uVar9 = uVar6 & 0x7fffffff;
    p_00 = (Vec_Int_t *)vInputs->pArray[uVar9];
    if (p_00 == (Vec_Int_t *)0x0) {
      p_00 = (Vec_Int_t *)malloc(0x10);
      p_00->nCap = 0x10;
      p_00->nSize = 0;
      piVar7 = (int *)malloc(0x40);
      p_00->pArray = piVar7;
      Vec_IntPush(p_00,uVar6 * 2);
      pVVar3 = p->pNtk->vObjs;
      if (pVVar3->nSize <= (int)uVar6) goto LAB_00261772;
      Vec_IntPush(p_00,*(uint *)((long)pVVar3->pArray[uVar9] + 0x14) >> 0xc);
      if (p_00->nSize != 2) {
        __assert_fail("SHARE_NUM == Vec_IntSize(vInput)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcExtract.c"
                      ,0x105,
                      "void Abc_NtkTraverseSupersXor_rec(Abc_ShaMan_t *, Abc_Obj_t *, Vec_Ptr_t *)")
        ;
      }
      if (vInputs->nSize <= (int)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vInputs->pArray[uVar9] = p_00;
    }
  }
LAB_002616cd:
  if ((*piVar12 < 0) || (1 < local_3c)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  Vec_IntPush(p->vObj2Lit,local_3c + *piVar12 * 2);
  if ((int)uVar4 < 1) {
    __ptr_00 = __ptr->pArray;
    if (__ptr_00 == (word *)0x0) goto LAB_0026174b;
  }
  else {
LAB_002616fa:
    __ptr_00 = __ptr->pArray;
    uVar11 = 0;
    do {
      uVar6 = (uint)__ptr_00[uVar11];
      if (((int)uVar6 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= (int)uVar6)) {
LAB_00261772:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_NtkTraverseSupersXor_rec(p,(Abc_Obj_t *)pVVar3->pArray[uVar6 & 0x7fffffff],vInputs);
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  free(__ptr_00);
LAB_0026174b:
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkTraverseSupersXor_rec( Abc_ShaMan_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vInputs )
{
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NodeIsExorType(pObj) )
    {
        Vec_Wrd_t * vSuper;
        int k, fCompl;
        word Num;
        vSuper = Abc_NtkShareSuperXor( pObj, &fCompl, &p->nFoundGates );
        if ( Vec_WrdSize(vSuper) <= 1 || Vec_WrdSize(vSuper) >= p->nMultiSize )
        {
            Vec_WrdForEachEntry( vSuper, Num, k )
            {
                Vec_Int_t * vInput = (Vec_Int_t *)Vec_PtrEntry( vInputs, (int)Num );
                if ( vInput == NULL )
                {
                    vInput = Vec_IntAlloc( 10 );
                    Vec_IntPush( vInput, Abc_Var2Lit((int)Num, 0) );
                    Vec_IntPush( vInput, Abc_ObjLevel(Abc_NtkObj(p->pNtk, (int)Num)) );
                    assert( SHARE_NUM == Vec_IntSize(vInput) );
                    Vec_PtrWriteEntry( vInputs, (int)Num, vInput );
                }
                Vec_IntPush( vInput, Vec_IntSize(p->vObj2Lit) );
            }
            Vec_IntPush( p->vObj2Lit, Abc_Var2Lit(Abc_ObjId(pObj), fCompl) );
        }
        // call recursively
        Vec_WrdForEachEntry( vSuper, Num, k )
            Abc_NtkTraverseSupersXor_rec( p, Abc_NtkObj(p->pNtk, (int)Num), vInputs );
        Vec_WrdFree( vSuper );
    }
    else
    {
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
        Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin1(pObj), vInputs );
    }
}